

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void file_compress(char *file,char *mode)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  FILE *pFVar6;
  gzFile pgVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  gzFile unaff_R12;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  char outfile [1024];
  undefined4 uStack_888;
  undefined1 uStack_884;
  char *pcStack_870;
  gzFile pgStack_868;
  ulong uStack_860;
  char *pcStack_858;
  char *pcStack_850;
  char acStack_840 [1024];
  char *pcStack_440;
  char acStack_418 [1024];
  
  pcVar10 = acStack_418;
  pcVar9 = mode;
  sVar5 = strlen(file);
  if (sVar5 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_418,0x400,"%s%s",file,".gz");
    pcVar9 = "rb";
    pFVar6 = fopen(file,"rb");
    if (pFVar6 == (FILE *)0x0) goto LAB_001016f1;
    pcVar9 = mode;
    pgVar7 = (gzFile)gzopen(acStack_418);
    if (pgVar7 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar6,pgVar7);
      unlink(file);
      return;
    }
  }
  file_compress_cold_1();
  pcVar15 = acStack_840;
  pcStack_440 = file;
  pcVar8 = (char *)strlen(pcVar10);
  uVar12 = (ulong)pcVar8 & 0xffffffff;
  if (uVar12 < 0x3fd) {
    unaff_R12 = (gzFile)0x400;
    snprintf(acStack_840,0x400,"%s",pcVar10);
    if (((uint)pcVar8 < 4) || (iVar3 = strcmp(pcVar10 + (uVar12 - 3),".gz"), iVar3 != 0)) {
      unaff_R12 = (gzFile)(0x400 - uVar12);
      snprintf(acStack_840 + uVar12,(size_t)unaff_R12,"%s",".gz");
      mode = acStack_840;
      pcVar15 = pcVar10;
    }
    else {
      acStack_840[(uint)pcVar8 - 3] = '\0';
      mode = pcVar10;
    }
    pcVar9 = "rb";
    pgVar7 = (gzFile)gzopen(mode);
    pcVar8 = pcVar15;
    if (pgVar7 == (gzFile)0x0) goto LAB_001017f3;
    pcVar9 = "wb";
    pFVar6 = fopen(pcVar15,"wb");
    if (pFVar6 != (FILE *)0x0) {
      gz_uncompress(pgVar7,(FILE *)pFVar6);
      unlink(mode);
      return;
    }
  }
  else {
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar7 = unaff_R12;
    file_uncompress_cold_2();
  }
  pcVar11 = pcVar10;
  file_uncompress_cold_1();
  uVar14 = (ulong)pcVar11 & 0xffffffff;
  uStack_884 = 0;
  uStack_888 = 0x20366277;
  pcVar15 = *(char **)pcVar9;
  prog = pcVar15;
  pcStack_870 = pcVar10;
  pgStack_868 = pgVar7;
  uStack_860 = uVar12;
  pcStack_858 = mode;
  pcStack_850 = pcVar8;
  pcVar8 = strrchr(pcVar15,0x2f);
  pcVar10 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar10 = pcVar15;
  }
  iVar3 = strcmp(pcVar10,"gunzip");
  if (iVar3 == 0) {
    bVar16 = true;
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(pcVar10,"zcat");
    bVar16 = iVar3 == 0;
    bVar1 = bVar16;
  }
  pcVar9 = pcVar9 + 8;
  iVar3 = (int)pcVar11 + -1;
  if ((int)pcVar11 < 2) {
LAB_0010193b:
    uStack_888 = uStack_888 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar10 = *(char **)pcVar9;
      if (*pcVar10 != '-') goto LAB_00101937;
      if ((pcVar10[1] == 'c') && (pcVar10[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar10[1] == 'd') && (pcVar10[2] == '\0')) {
        bVar16 = true;
      }
      else if ((pcVar10[1] == 'f') && (pcVar10[2] == '\0')) {
        uStack_888 = CONCAT13(0x66,(undefined3)uStack_888);
        cVar2 = 'f';
      }
      else if ((pcVar10[1] == 'h') && (pcVar10[2] == '\0')) {
        uStack_888 = CONCAT13(0x68,(undefined3)uStack_888);
        cVar2 = 'h';
      }
      else if ((pcVar10[1] == 'r') && (pcVar10[2] == '\0')) {
        uStack_888 = CONCAT13(0x52,(undefined3)uStack_888);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar10[1] - 0x31U)) goto LAB_00101937;
        if (pcVar10[2] != '\0') {
          iVar3 = (int)uVar14 + -1;
          goto LAB_00101937;
        }
        uStack_888._0_3_ = CONCAT12(pcVar10[1],(undefined2)uStack_888);
      }
      pcVar9 = pcVar9 + 8;
      iVar3 = iVar3 + -1;
      uVar13 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar13;
    } while (1 < (int)uVar13);
    iVar3 = 0;
LAB_00101937:
    if (cVar2 == ' ') goto LAB_0010193b;
  }
  if (iVar3 == 0) {
    if (bVar16) {
      iVar3 = fileno(_stdin);
      pgVar7 = (gzFile)gzdopen(iVar3,"rb");
      if (pgVar7 == (gzFile)0x0) {
LAB_00101a73:
        main_cold_3();
LAB_00101a78:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar7,(FILE *)_stdout);
    }
    else {
      iVar3 = fileno(_stdout);
      pgVar7 = (gzFile)gzdopen(iVar3,&uStack_888);
      if (pgVar7 == (gzFile)0x0) goto LAB_00101a78;
      gz_compress((FILE *)_stdin,pgVar7);
    }
  }
  else {
    do {
      pcVar10 = *(char **)pcVar9;
      if (bVar16) {
        if (bVar1) {
          pgVar7 = (gzFile)gzopen(pcVar10,"rb");
          if (pgVar7 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar7,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar10);
        }
      }
      else if (bVar1) {
        pFVar6 = fopen(pcVar10,"rb");
        if (pFVar6 == (FILE *)0x0) {
          perror(*(char **)pcVar9);
        }
        else {
          iVar4 = fileno(_stdout);
          pgVar7 = (gzFile)gzdopen(iVar4,&uStack_888);
          if (pgVar7 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a73;
          }
          gz_compress((FILE *)pFVar6,pgVar7);
        }
      }
      else {
        file_compress(pcVar10,(char *)&uStack_888);
      }
      pcVar9 = pcVar9 + 8;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void file_compress(file, mode)
    char  *file;
    char  *mode;
{
    local char outfile[MAX_NAME_LEN];
    FILE  *in;
    gzFile out;

    if (strlen(file) + strlen(GZ_SUFFIX) >= sizeof(outfile)) {
        fprintf(stderr, "%s: filename too long\n", prog);
        exit(1);
    }

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outfile, sizeof(outfile), "%s%s", file, GZ_SUFFIX);
#else
    strcpy(outfile, file);
    strcat(outfile, GZ_SUFFIX);
#endif

    in = fopen(file, "rb");
    if (in == NULL) {
        perror(file);
        exit(1);
    }
    out = gzopen(outfile, mode);
    if (out == NULL) {
        fprintf(stderr, "%s: can't gzopen %s\n", prog, outfile);
        exit(1);
    }
    gz_compress(in, out);

    unlink(file);
}